

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  ulong uVar2;
  char extraout_AL;
  char cVar3;
  int iVar4;
  ushort **ppuVar5;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int raw;
  char cVar11;
  
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "rdjpgcom";
  }
  iVar6 = 0;
  uVar8 = 1;
  cVar11 = 1 < argc;
  if (argc < 2) {
    raw = 0;
  }
  else {
    pcVar10 = argv[1];
    raw = 0;
    if (*pcVar10 == '-') {
      uVar2 = (ulong)(uint)argc;
      uVar8 = 1;
      iVar6 = 0;
      raw = 0;
      do {
        pcVar10 = pcVar10 + 1;
        iVar4 = keymatch(pcVar10,"verbose",(int)in_RDX);
        if (iVar4 == 0) {
          pcVar7 = "raw";
          iVar4 = keymatch(pcVar10,"raw",(int)extraout_RDX);
          raw = 1;
          in_RDX = extraout_RDX_00;
          if (iVar4 == 0) {
            usage();
            cVar11 = *pcVar10;
            if (cVar11 != '\0') {
              lVar9 = 0;
              cVar3 = cVar11;
              do {
                cVar1 = pcVar7[lVar9];
                if (cVar1 == '\0') {
                  return 0;
                }
                iVar6 = (int)cVar3;
                ppuVar5 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar5 + (long)iVar6 * 2 + 1) & 1) != 0) {
                  iVar6 = tolower(iVar6);
                }
                if (iVar6 != cVar1) {
                  return 0;
                }
                cVar3 = pcVar10[lVar9 + 1];
                lVar9 = lVar9 + 1;
              } while (cVar3 != '\0');
            }
            return (uint)(cVar11 != '\0');
          }
        }
        else {
          iVar6 = iVar6 + 1;
          in_RDX = extraout_RDX;
        }
        if ((2 - uVar2) + uVar8 == 1) {
          cVar11 = uVar8 + 1 < uVar2;
          uVar8 = (ulong)(uint)argc;
          goto LAB_0010140a;
        }
        pcVar10 = argv[uVar8 + 1];
        uVar8 = uVar8 + 1;
      } while (*pcVar10 == '-');
      cVar11 = uVar8 < uVar2;
    }
  }
LAB_0010140a:
  if ((int)uVar8 < argc + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
    cVar11 = extraout_AL;
  }
  if (cVar11 == '\0') {
    infile = _stdin;
  }
  else {
    infile = (FILE *)fopen(argv[uVar8 & 0xffffffff],"rb");
    if ((FILE *)infile == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,argv[uVar8 & 0xffffffff]);
      exit(1);
    }
  }
  scan_JPEG_header(iVar6,raw);
  exit(0);
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int verbose = 0, raw = 0;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "rdjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "verbose", 1)) {
      verbose++;
    } else if (keymatch(arg, "raw", 1)) {
      raw = 1;
    } else
      usage();
  }

  /* Open the input file. */
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Scan the JPEG headers. */
  (void)scan_JPEG_header(verbose, raw);

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}